

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  _Base_ptr *pp_Var1;
  long lVar2;
  pointer ppVar3;
  __pthread_internal_list *p_Var4;
  long lVar5;
  long *plVar6;
  Env *pEVar7;
  Logger *info_log;
  Version *v;
  _Base_ptr p_Var8;
  pthread_mutex_t *in_RCX;
  VersionSet *this_00;
  long in_FS_OFFSET;
  Status local_220;
  undefined1 local_218 [8];
  string local_210;
  string record;
  string new_manifest_file;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] == '\x01') {
    ppVar3 = (pointer)(mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    if (ppVar3 < *(pointer *)&(edit->deleted_files_)._M_t._M_impl) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((edit->compact_pointers_).
        super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ._M_impl.super__Vector_impl_data._M_start <= ppVar3) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x30d,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  else {
    p_Var4 = *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] = '\x01';
    (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next = p_Var4;
  }
  if (mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] == '\0') {
    lVar5 = *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] = '\x01';
    mu[1].mu_.super___mutex_base._M_mutex.__align = lVar5;
  }
  ppVar3 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar3;
  ppVar3 = (edit->compact_pointers_).
           super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  mu[1].mu_.super___mutex_base._M_mutex.__size[0x1c] = '\x01';
  *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 0x10) = ppVar3;
  v = (Version *)operator_new(0xe8);
  v->vset_ = (VersionSet *)edit;
  v->next_ = v;
  v->prev_ = v;
  v->refs_ = 0;
  memset(v->files_,0,0xb0);
  v->file_to_compact_level_ = -1;
  v->compaction_score_ = -1.0;
  v->compaction_level_ = -1;
  Builder::Builder((Builder *)&new_manifest_file,(VersionSet *)edit,
                   *(Version **)((long)&edit[2].comparator_.field_2 + 8));
  Builder::Apply((Builder *)&new_manifest_file,(VersionEdit *)mu);
  Builder::SaveTo((Builder *)&new_manifest_file,v);
  this_00 = (VersionSet *)&new_manifest_file;
  Builder::~Builder((Builder *)this_00);
  Finalize(this_00,v);
  new_manifest_file._M_dataplus._M_p = (pointer)&new_manifest_file.field_2;
  new_manifest_file._M_string_length = 0;
  this->env_ = (Env *)0x0;
  new_manifest_file.field_2._M_local_buf[0] = '\0';
  if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
  {
    if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      __assert_fail("descriptor_file_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                    ,0x328,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    DescriptorFileName(&record,(string *)&(edit->comparator_)._M_string_length,
                       (uint64_t)
                       (edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    pp_Var1 = &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&new_manifest_file,&record);
    std::__cxx11::string::~string((string *)&record);
    ppVar3 = (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    mu[1].mu_.super___mutex_base._M_mutex.__size[0x1b] = '\x01';
    *(pointer *)((long)&mu[1].mu_.super___mutex_base._M_mutex + 8) = ppVar3;
    plVar6 = (long *)(edit->comparator_)._M_dataplus._M_p;
    (**(code **)(*plVar6 + 0x20))(&record,plVar6,&new_manifest_file,pp_Var1);
    pEVar7 = this->env_;
    this->env_ = (Env *)record._M_dataplus._M_p;
    record._M_dataplus._M_p = (pointer)pEVar7;
    Status::~Status((Status *)&record);
    if (this->env_ == (Env *)0x0) {
      p_Var8 = (_Base_ptr)operator_new(0x20);
      log::Writer::Writer((Writer *)p_Var8,(WritableFile *)*pp_Var1);
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
      WriteSnapshot((VersionSet *)&record,(Writer *)edit);
      pEVar7 = this->env_;
      this->env_ = (Env *)record._M_dataplus._M_p;
      record._M_dataplus._M_p = (pointer)pEVar7;
      Status::~Status((Status *)&record);
    }
  }
  pthread_mutex_unlock(in_RCX);
  if (this->env_ != (Env *)0x0) goto LAB_0053ca51;
  record._M_dataplus._M_p = (pointer)&record.field_2;
  record._M_string_length = 0;
  record.field_2._M_local_buf[0] = '\0';
  VersionEdit::EncodeTo((VersionEdit *)mu,&record);
  local_210._M_dataplus._M_p = record._M_dataplus._M_p;
  local_210._M_string_length = record._M_string_length;
  log::Writer::AddRecord
            ((Writer *)local_218,
             (Slice *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  pEVar7 = this->env_;
  this->env_ = (Env *)local_218;
  local_218 = (undefined1  [8])pEVar7;
  Status::~Status((Status *)local_218);
  if (this->env_ == (Env *)0x0) {
    (**(code **)(*(long *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent + 0x28))(&local_210);
    pEVar7 = this->env_;
    this->env_ = (Env *)local_210._M_dataplus._M_p;
    local_210._M_dataplus._M_p = (pointer)pEVar7;
    Status::~Status((Status *)&local_210);
    if (this->env_ != (Env *)0x0) goto LAB_0053c9d9;
  }
  else {
LAB_0053c9d9:
    info_log = *(Logger **)(edit->prev_log_number_ + 0x18);
    Status::ToString_abi_cxx11_(&local_210,(Status *)this);
    Log(info_log,"MANIFEST write: %s\n",local_210._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::__cxx11::string::~string((string *)&record);
  if ((this->env_ == (Env *)0x0) && (new_manifest_file._M_string_length != 0)) {
    SetCurrentFile((leveldb *)&record,(Env *)(edit->comparator_)._M_dataplus._M_p,
                   (string *)&(edit->comparator_)._M_string_length,
                   (uint64_t)
                   (edit->compact_pointers_).
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    pEVar7 = this->env_;
    this->env_ = (Env *)record._M_dataplus._M_p;
    record._M_dataplus._M_p = (pointer)pEVar7;
    Status::~Status((Status *)&record);
  }
LAB_0053ca51:
  std::mutex::lock((mutex *)&in_RCX->__data);
  if (this->env_ == (Env *)0x0) {
    AppendVersion((VersionSet *)edit,v);
    lVar5 = mu[1].mu_.super___mutex_base._M_mutex.__align;
    *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl =
         (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header = lVar5;
  }
  else {
    Version::~Version(v);
    operator_delete(v,0xe8);
    if (new_manifest_file._M_string_length != 0) {
      p_Var8 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var8 != (_Base_ptr)0x0) {
        log::Writer::~Writer((Writer *)p_Var8);
      }
      operator_delete(p_Var8,0x20);
      p_Var8 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var8 + 8))();
      }
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      plVar6 = (long *)(edit->comparator_)._M_dataplus._M_p;
      (**(code **)(*plVar6 + 0x40))(&local_220,plVar6,&new_manifest_file);
      Status::~Status(&local_220);
    }
  }
  std::__cxx11::string::~string((string *)&new_manifest_file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->DeleteFile(new_manifest_file);
    }
  }

  return s;
}